

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O0

void beltHMACStepG_internal(void *state)

{
  u32 *in_RDI;
  u32 *unaff_retaddr;
  belt_hmac_st *st;
  undefined7 in_stack_ffffffffffffffe8;
  octet in_stack_ffffffffffffffef;
  u32 *h;
  
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 4);
  *(undefined8 *)(in_RDI + 0x32) = *(undefined8 *)(in_RDI + 6);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 8);
  *(undefined8 *)(in_RDI + 0x12) = *(undefined8 *)(in_RDI + 10);
  *(undefined8 *)(in_RDI + 0x14) = *(undefined8 *)(in_RDI + 0xc);
  *(undefined8 *)(in_RDI + 0x16) = *(undefined8 *)(in_RDI + 0xe);
  h = in_RDI;
  if (*(long *)(in_RDI + 0x3c) != 0) {
    memSet(in_RDI,in_stack_ffffffffffffffef,0x173d14);
    beltCompr2(unaff_retaddr,h,in_RDI,
               (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  beltCompr(unaff_retaddr,h,in_RDI);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 6) = *(undefined8 *)(in_RDI + 0x32);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x1c);
  *(undefined8 *)(in_RDI + 0x32) = *(undefined8 *)(in_RDI + 0x1e);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x2a) = *(undefined8 *)(in_RDI + 0x22);
  *(undefined8 *)(in_RDI + 0x2c) = *(undefined8 *)(in_RDI + 0x24);
  *(undefined8 *)(in_RDI + 0x2e) = *(undefined8 *)(in_RDI + 0x26);
  beltCompr2(unaff_retaddr,h,in_RDI,
             (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  beltCompr(unaff_retaddr,h,in_RDI);
  *(undefined8 *)(in_RDI + 0x1c) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x1e) = *(undefined8 *)(in_RDI + 0x32);
  return;
}

Assistant:

static void beltHMACStepG_internal(void* state)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	// pre
	ASSERT(memIsValid(state, beltHash_keep()));
	// создать копии второй части st->ls_in и st->h_in
	beltBlockCopy(st->s1, st->ls_in + 4);
	beltBlockCopy(st->h1_in, st->h_in);
	beltBlockCopy(st->h1_in + 4, st->h_in + 4);
	// есть необработанные данные?
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls_in + 4, st->h1_in, (u32*)st->block, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block + 16);
		beltBlockRevU32(st->block);
#endif
	}
	// последний блок внутреннего хэширования
	beltCompr(st->h1_in, st->ls_in, st->stack);
	// восстановить сохраненную часть st->ls_in
	beltBlockCopy(st->ls_in + 4, st->s1);
	// создать копии второй части st->ls_out и st->h_out
	beltBlockCopy(st->s1, st->ls_out + 4);
	beltBlockCopy(st->h1_out, st->h_out);
	beltBlockCopy(st->h1_out + 4, st->h_out + 4);
	// обработать блок st->h1_in
	beltCompr2(st->ls_out + 4, st->h1_out, st->h1_in, st->stack);
	// последний блок внешнего хэширования
	beltCompr(st->h1_out, st->ls_out, st->stack);
	// восстановить сохраненную часть st->ls_out
	beltBlockCopy(st->ls_out + 4, st->s1);
}